

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CBillboardSceneNode::CBillboardSceneNode
          (CBillboardSceneNode *this,ISceneNode *parent,ISceneManager *mgr,s32 id,
          vector3df *position,dimension2d<float> *size,SColor colorTop,SColor colorBottom)

{
  void *pvVar1;
  unsigned_short *puVar2;
  S3DVertex *pSVar3;
  CMeshBuffer<irr::video::S3DVertex> *in_RDI;
  undefined8 in_R9;
  u32 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000020;
  u32 usedNow;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI->BoundingBox);
  IBillboardSceneNode::IBillboardSceneNode
            ((IBillboardSceneNode *)parent,&mgr->_vptr_ISceneManager,
             (ISceneNode *)CONCAT44(id,in_stack_00000020),(ISceneManager *)position,size._4_4_,
             (vector3df *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  (in_RDI->super_IMeshBuffer)._vptr_IMeshBuffer = (_func_int **)0x437fe8;
  (in_RDI->Material).TextureLayers[0].TextureMatrix = (matrix4 *)(vtable + 0x238);
  (in_RDI->BoundingBox).MinEdge.X = 6.200163e-39;
  (in_RDI->BoundingBox).MinEdge.Y = 0.0;
  core::dimension2d<float>::dimension2d
            ((dimension2d<float> *)&(in_RDI->super_IMeshBuffer).field_0x8);
  core::aabbox3d<float>::aabbox3d((aabbox3d<float> *)in_RDI);
  pvVar1 = operator_new(0x150);
  CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(in_RDI);
  *(void **)&(in_RDI->Material).TextureLayers[0].MagFilter = pvVar1;
  (*(in_RDI->super_IMeshBuffer)._vptr_IMeshBuffer[5])(in_RDI,in_R9);
  usedNow = (u32)((ulong)pvVar1 >> 0x20);
  core::array<irr::video::S3DVertex>::set_used((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  core::array<unsigned_short>::set_used((array<unsigned_short> *)in_RDI,usedNow);
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 0;
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 2;
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 1;
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 0;
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 3;
  puVar2 = core::array<unsigned_short>::operator[]((array<unsigned_short> *)in_RDI,usedNow);
  *puVar2 = 2;
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  core::vector2d<float>::set(&pSVar3->TCoords,1.0,1.0);
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  (pSVar3->Color).color = (u32)size;
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  core::vector2d<float>::set(&pSVar3->TCoords,1.0,0.0);
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  (pSVar3->Color).color = in_stack_00000008;
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  core::vector2d<float>::set(&pSVar3->TCoords,0.0,0.0);
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  (pSVar3->Color).color = in_stack_00000008;
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  core::vector2d<float>::set(&pSVar3->TCoords,0.0,1.0);
  pSVar3 = core::array<irr::video::S3DVertex>::operator[]
                     ((array<irr::video::S3DVertex> *)in_RDI,usedNow);
  (pSVar3->Color).color = (u32)size;
  return;
}

Assistant:

CBillboardSceneNode::CBillboardSceneNode(ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::dimension2d<f32> &size,
		video::SColor colorTop, video::SColor colorBottom) :
		IBillboardSceneNode(parent, mgr, id, position),
		Buffer(new SMeshBuffer())
{
#ifdef _DEBUG
	setDebugName("CBillboardSceneNode");
#endif

	setSize(size);

	Buffer->Vertices.set_used(4);
	Buffer->Indices.set_used(6);

	Buffer->Indices[0] = 0;
	Buffer->Indices[1] = 2;
	Buffer->Indices[2] = 1;
	Buffer->Indices[3] = 0;
	Buffer->Indices[4] = 3;
	Buffer->Indices[5] = 2;

	Buffer->Vertices[0].TCoords.set(1.0f, 1.0f);
	Buffer->Vertices[0].Color = colorBottom;

	Buffer->Vertices[1].TCoords.set(1.0f, 0.0f);
	Buffer->Vertices[1].Color = colorTop;

	Buffer->Vertices[2].TCoords.set(0.0f, 0.0f);
	Buffer->Vertices[2].Color = colorTop;

	Buffer->Vertices[3].TCoords.set(0.0f, 1.0f);
	Buffer->Vertices[3].Color = colorBottom;
}